

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

string * duckdb::QueryProfiler::JSONSanitize(string *__return_storage_ptr__,string *text)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = text->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (text->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      cVar1 = pcVar3[sVar4];
      switch(cVar1) {
      case '\b':
        break;
      case '\t':
        break;
      case '\n':
        break;
      case '\v':
switchD_004e2be3_caseD_b:
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
        goto LAB_004e2c38;
      case '\f':
        break;
      case '\r':
        break;
      default:
        if ((cVar1 != '\"') && (cVar1 != '\\')) goto switchD_004e2be3_caseD_b;
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_004e2c38:
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::JSONSanitize(const std::string &text) {
	string result;
	result.reserve(text.size());
	for (char i : text) {
		switch (i) {
		case '\b':
			result += "\\b";
			break;
		case '\f':
			result += "\\f";
			break;
		case '\n':
			result += "\\n";
			break;
		case '\r':
			result += "\\r";
			break;
		case '\t':
			result += "\\t";
			break;
		case '"':
			result += "\\\"";
			break;
		case '\\':
			result += "\\\\";
			break;
		default:
			result += i;
			break;
		}
	}
	return result;
}